

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void> *this,Arg *arg)

{
  ushort uVar1;
  undefined8 uVar2;
  uint uVar3;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  int iVar4;
  
  iVar4 = (int)arg;
  switch(*(undefined4 *)(CONCAT71(in_register_00000011,in_DL) + 0x10)) {
  case 2:
  case 3:
  case 7:
    uVar1 = *(ushort *)CONCAT71(in_register_00000011,in_DL);
    uVar3 = (uint)uVar1;
    if ((iVar4 == 0x69) || (iVar4 == 100)) {
      *(undefined4 *)(this + 0x10) = 2;
      uVar3 = (uint)(short)uVar1;
    }
    else {
      *(undefined4 *)(this + 0x10) = 3;
    }
    break;
  case 4:
  case 5:
    uVar2 = *(undefined8 *)CONCAT71(in_register_00000011,in_DL);
    if ((iVar4 == 0x69) || (iVar4 == 100)) {
      *(undefined4 *)(this + 0x10) = 2;
      uVar3 = (uint)(short)uVar2;
    }
    else {
      *(undefined4 *)(this + 0x10) = 3;
      uVar3 = (uint)uVar2 & 0xffff;
    }
    break;
  case 6:
    if (iVar4 == 0x73) {
      return;
    }
    uVar3 = (uint)(*(int *)CONCAT71(in_register_00000011,in_DL) != 0);
    *(uint *)(this + 0x10) = (iVar4 == 100 || iVar4 == 0x69) ^ 3;
    break;
  default:
    goto switchD_0014b4fb_default;
  }
  *(uint *)this = uVar3;
switchD_0014b4fb_default:
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }